

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_block(any *context,HTTPRequest *req,string *strURIPart,TxVerbosity tx_verbosity)

{
  pointer pcVar1;
  pointer ppCVar2;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  bool bVar3;
  RESTResponseFormat RVar4;
  ChainstateManager *this;
  Chainstate *pCVar5;
  CBlockIndex *blockindex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined4 in_register_0000000c;
  char *pcVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  BlockManager *this_00;
  long in_FS_OFFSET;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  Span<const_unsigned_char> s;
  Span<const_std::byte> sp;
  FlatFilePos pos;
  string strJSON;
  UniValue objBlock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  DataStream block_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  optional<uint256> hash;
  string hashStr;
  CBlockIndex *local_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  FlatFilePos local_298;
  string local_290;
  string local_270;
  undefined1 local_250 [40];
  __extent_storage<18446744073709551615UL> local_228;
  pointer local_220;
  pointer pbStack_218;
  undefined1 local_210 [88];
  undefined1 local_1b8 [16];
  mutex_type local_1a8;
  uchar auStack_180 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_168;
  undefined3 uStack_150;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  optional<uint256> local_79;
  string local_58;
  long local_38;
  
  pcVar7 = (char *)CONCAT44(in_register_0000000c,tx_verbosity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CheckWarmup(req);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00292878;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  RVar4 = ParseDataFormat(&local_58,strURIPart);
  str._M_str = pcVar7;
  str._M_len = (size_t)local_58._M_dataplus._M_p;
  detail::FromHex<uint256>(&local_79,(detail *)local_58._M_string_length,str);
  if (local_79.super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    std::operator+(&local_a0,"Invalid hash: ",&local_58);
    RESTERR(req,HTTP_BAD_REQUEST,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
LAB_00292859:
    bVar3 = false;
  }
  else {
    local_298.nFile = -1;
    local_298.nPos = 0;
    this = GetChainman(context,req);
    if (this == (ChainstateManager *)0x0) goto LAB_00292859;
    local_1b8._0_8_ = &cs_main;
    local_1b8[8] = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1b8);
    pCVar5 = ChainstateManager::ActiveChainstate(this);
    ppCVar2 = (pCVar5->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar2 ==
        (pCVar5->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_2c8 = (CBlockIndex *)0x0;
    }
    else {
      local_2c8 = ppCVar2[-1];
    }
    this_00 = &this->m_blockman;
    blockindex = node::BlockManager::LookupBlockIndex(this_00,(uint256 *)&local_79);
    if (blockindex == (CBlockIndex *)0x0) {
      paVar9 = &local_c0.field_2;
      local_c0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_58._M_dataplus._M_p,
                 (detail *)(local_58._M_string_length + (long)local_58._M_dataplus._M_p));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_c0," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_c0);
      _Var8._M_p = local_c0._M_dataplus._M_p;
LAB_0029283c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar9) {
        operator_delete(_Var8._M_p,paVar9->_M_allocated_capacity + 1);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_1b8);
      goto LAB_00292859;
    }
    if ((blockindex->nStatus & 8) == 0) {
      bVar3 = node::BlockManager::IsBlockPruned(this_00,blockindex);
      if (bVar3) {
        paVar9 = &local_e0.field_2;
        local_e0._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_58._M_dataplus._M_p,
                   (detail *)(local_58._M_string_length + (long)local_58._M_dataplus._M_p));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_e0," not available (pruned data)");
        RESTERR(req,HTTP_NOT_FOUND,&local_e0);
        _Var8._M_p = local_e0._M_dataplus._M_p;
      }
      else {
        paVar9 = &local_100.field_2;
        local_100._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_58._M_dataplus._M_p,
                   (detail *)(local_58._M_string_length + (long)local_58._M_dataplus._M_p));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_100," not available (not fully downloaded)");
        RESTERR(req,HTTP_NOT_FOUND,&local_100);
        _Var8._M_p = local_100._M_dataplus._M_p;
      }
      goto LAB_0029283c;
    }
    local_298.nFile = blockindex->nFile;
    local_298.nPos = blockindex->nDataPos;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_1b8);
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = node::BlockManager::ReadRawBlockFromDisk(this_00,&local_2b8,&local_298);
    if (bVar3) {
      if (RVar4 == JSON) {
        local_168.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_168.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        auStack_180._16_8_ = 0;
        auStack_180._8_8_ = 0;
        auStack_180[0] = '\0';
        auStack_180[1] = '\0';
        auStack_180[2] = '\0';
        auStack_180[3] = '\0';
        auStack_180[4] = '\0';
        auStack_180[5] = '\0';
        auStack_180[6] = '\0';
        auStack_180[7] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        local_1a8.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x10] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x11] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x12] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x13] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x14] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x15] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x16] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex.__size[0x17] = '\0';
        local_1a8.super___recursive_mutex_base._M_mutex._8_8_ = 0;
        local_1a8.super___recursive_mutex_base._M_mutex.__align = 0;
        local_1b8[9] = '\0';
        local_1b8[10] = '\0';
        local_1b8[0xb] = '\0';
        local_1b8[0xc] = '\0';
        local_1b8[0xd] = '\0';
        local_1b8[0xe] = '\0';
        local_1b8[0xf] = '\0';
        local_1b8[8] = false;
        local_1b8._0_8_ = (mutex_type *)0x0;
        local_168.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uStack_150._0_1_ = false;
        uStack_150._1_1_ = false;
        uStack_150._2_1_ = false;
        sp.m_size = (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        sp.m_data = local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        DataStream::DataStream((DataStream *)&local_140,sp);
        local_210._0_8_ = &TX_WITH_WITNESS;
        local_210._8_8_ = &local_140;
        CBlock::
        SerializationOps<ParamsStream<DataStream&,TransactionSerParams>,CBlock,ActionUnserialize>
                  (local_1b8);
        blockToJSON((UniValue *)local_210,this_00,(CBlock *)local_1b8,local_2c8,blockindex,
                    tx_verbosity);
        UniValue::write_abi_cxx11_((UniValue *)local_250,(int)local_210,(void *)0x0,0);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_250,"\n");
        local_250._32_8_ = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._32_8_ == paVar9) {
          local_220 = (pointer)paVar9->_M_allocated_capacity;
          pbStack_218 = *(pointer *)((long)&pbVar6->field_2 + 8);
          local_250._32_8_ = &local_220;
        }
        else {
          local_220 = (pointer)paVar9->_M_allocated_capacity;
        }
        local_228._M_extent_value = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        pcVar1 = local_250 + 0x10;
        if ((pointer)local_250._0_8_ != pcVar1) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        local_250._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"Content-Type","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"application/json","");
        HTTPRequest::WriteHeader(req,(string *)local_250,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_250._0_8_ != pcVar1) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        reply._M_extent._M_extent_value = local_228._M_extent_value;
        reply._M_ptr = (pointer)local_250._32_8_;
        HTTPRequest::WriteReply(req,200,reply);
        if ((pointer *)local_250._32_8_ != &local_220) {
          operator_delete((void *)local_250._32_8_,(ulong)((long)&(local_220->_M_dataplus)._M_p + 1)
                         );
        }
        UniValue::~UniValue((UniValue *)local_210);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_140);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&local_168);
      }
      else {
        if (RVar4 != HEX) {
          if (RVar4 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,"output format not found (available: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210);
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b8,")");
            local_290._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
            paVar9 = &pbVar6->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p == paVar9) {
              local_290.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_290._M_string_length = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar6->_M_string_length = 0;
            (pbVar6->field_2)._M_local_buf[0] = '\0';
            RESTERR(req,HTTP_NOT_FOUND,&local_290);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((mutex_type *)local_1b8._0_8_ != (mutex_type *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,
                              local_1a8.super___recursive_mutex_base._M_mutex.__align + 1);
            }
            local_120.field_2._M_allocated_capacity = local_210._16_8_;
            _Var8._M_p = (pointer)local_210._0_8_;
            if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) goto LAB_0029290d;
            goto LAB_00292915;
          }
          local_1b8._0_8_ = (mutex_type *)(local_1b8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
          local_210._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_210 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_210,"application/octet-stream","");
          HTTPRequest::WriteHeader(req,(string *)local_1b8,(string *)local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          if ((mutex_type *)local_1b8._0_8_ != (mutex_type *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,
                            local_1a8.super___recursive_mutex_base._M_mutex.__align + 1);
          }
          reply_01._M_extent._M_extent_value =
               (long)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          bVar3 = true;
          reply_01._M_ptr =
               local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          HTTPRequest::WriteReply(req,200,reply_01);
          goto LAB_00292e24;
        }
        s.m_size = (long)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        s.m_data = local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_((string *)local_210,s);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_210,"\n");
        local_1b8._0_8_ = (pbVar6->_M_dataplus)._M_p;
        paVar9 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._0_8_ == paVar9) {
          local_1a8.super___recursive_mutex_base._M_mutex.__align = paVar9->_M_allocated_capacity;
          local_1a8.super___recursive_mutex_base._M_mutex._8_8_ =
               *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_1b8._0_8_ = (mutex_type *)(local_1b8 + 0x10);
        }
        else {
          local_1a8.super___recursive_mutex_base._M_mutex.__align = paVar9->_M_allocated_capacity;
        }
        local_1b8[8] = SUB81(pbVar6->_M_string_length,0);
        local_1b8._9_7_ = (undefined7)(pbVar6->_M_string_length >> 8);
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_210 + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ != paVar9) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        local_210._0_8_ = paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Content-Type","");
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"text/plain","");
        HTTPRequest::WriteHeader(req,(string *)local_210,&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ != paVar9) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        reply_00._M_extent._M_extent_value._0_1_ = local_1b8[8];
        reply_00._M_ptr = (pointer)local_1b8._0_8_;
        reply_00._M_extent._M_extent_value._1_7_ = local_1b8._9_7_;
        HTTPRequest::WriteReply(req,200,reply_00);
        if ((mutex_type *)local_1b8._0_8_ != (mutex_type *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,
                          local_1a8.super___recursive_mutex_base._M_mutex.__align + 1);
        }
      }
      bVar3 = true;
    }
    else {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_58._M_dataplus._M_p,
                 (detail *)(local_58._M_string_length + (long)local_58._M_dataplus._M_p));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_120," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_120);
      _Var8._M_p = local_120._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_0029290d:
        operator_delete(_Var8._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
LAB_00292915:
      bVar3 = false;
    }
LAB_00292e24:
    if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_00292878:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_block(const std::any& context,
                       HTTPRequest* req,
                       const std::string& strURIPart,
                       TxVerbosity tx_verbosity)
{
    if (!CheckWarmup(req))
        return false;
    std::string hashStr;
    const RESTResponseFormat rf = ParseDataFormat(hashStr, strURIPart);

    auto hash{uint256::FromHex(hashStr)};
    if (!hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hashStr);
    }

    FlatFilePos pos{};
    const CBlockIndex* pblockindex = nullptr;
    const CBlockIndex* tip = nullptr;
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    {
        LOCK(cs_main);
        tip = chainman.ActiveChain().Tip();
        pblockindex = chainman.m_blockman.LookupBlockIndex(*hash);
        if (!pblockindex) {
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
        }
        if (!(pblockindex->nStatus & BLOCK_HAVE_DATA)) {
            if (chainman.m_blockman.IsBlockPruned(*pblockindex)) {
                return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (pruned data)");
            }
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (not fully downloaded)");
        }
        pos = pblockindex->GetBlockPos();
    }

    std::vector<uint8_t> block_data{};
    if (!chainman.m_blockman.ReadRawBlockFromDisk(block_data, pos)) {
        return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, std::as_bytes(std::span{block_data}));
        return true;
    }

    case RESTResponseFormat::HEX: {
        const std::string strHex{HexStr(block_data) + "\n"};
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        CBlock block{};
        DataStream block_stream{block_data};
        block_stream >> TX_WITH_WITNESS(block);
        UniValue objBlock = blockToJSON(chainman.m_blockman, block, *tip, *pblockindex, tx_verbosity);
        std::string strJSON = objBlock.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }

    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}